

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DashTests.cpp
# Opt level: O2

void __thiscall
agge::tests::DashTests::ClosedPolygonProducesDashesForTheClosingSegment(DashTests *this)

{
  undefined8 uVar1;
  long lVar2;
  undefined8 *puVar3;
  point *ppVar4;
  byte bVar5;
  allocator local_1a1;
  dash d;
  point local_148;
  point local_13c;
  point local_130;
  point local_124;
  point local_118;
  point local_10c;
  point local_100;
  point local_f4;
  point local_e8;
  point local_dc;
  string local_d0;
  LocationInfo local_b0;
  point reference [10];
  
  bVar5 = 0;
  dash::dash(&d);
  dash::add_dash(&d,2.0,1.0);
  move_to<agge::dash>(&d,-2.0,2.0);
  dash::add_vertex(&d,-2.0,-1.0,2);
  dash::add_vertex(&d,2.0,-1.0,2);
  end_poly<agge::dash>(&d,true);
  local_148 = vertex<agge::dash>(&d);
  local_13c = vertex<agge::dash>(&d);
  local_130 = vertex<agge::dash>(&d);
  local_124 = vertex<agge::dash>(&d);
  local_118 = vertex<agge::dash>(&d);
  local_10c = vertex<agge::dash>(&d);
  local_100 = vertex<agge::dash>(&d);
  local_f4 = vertex<agge::dash>(&d);
  local_e8 = vertex<agge::dash>(&d);
  local_dc = vertex<agge::dash>(&d);
  puVar3 = &DAT_001a5b50;
  ppVar4 = reference;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    uVar1 = *puVar3;
    ppVar4->x = (real_t)(int)uVar1;
    ppVar4->y = (real_t)(int)((ulong)uVar1 >> 0x20);
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    ppVar4 = (point *)((long)ppVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  std::__cxx11::string::string
            ((string *)&local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,&local_1a1);
  ut::LocationInfo::LocationInfo(&local_b0,&local_d0,300);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,10ul>
            (&reference,(point (*) [10])&local_148,&local_b0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  dash::~dash(&d);
  return;
}

Assistant:

test( ClosedPolygonProducesDashesForTheClosingSegment )
			{
				// INIT
				dash d;

				d.add_dash(2.0f, 1.0f);

				// ACT
				move_to(d, -2.0f, 2.0f);
				line_to(d, -2.0f, -1.0f);
				line_to(d, 2.0f, -1.0f);
				end_poly(d, true);

				mocks::path::point result[] = {
					vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d), vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d),
				};

				// ASSERT
				mocks::path::point reference[] = {
					{ -2.0f, 2.0f, path_command_move_to }, { -2.0f, 0.0f, path_command_line_to },
					{ -2.0f, -1.0f, path_command_move_to }, { 0.0f, -1.0f, path_command_line_to },
					{ 1.0f, -1.0f, path_command_move_to }, { 2.0f, -1.0f, path_command_line_to }, { 1.2f, -0.4f, path_command_line_to },
					{ 0.4f, 0.2f, path_command_move_to }, { -1.2f, 1.4f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference, result);
			}